

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O3

void __thiscall Transporter::Receive(Transporter *this,char *data,size_t len)

{
  ulong uVar1;
  byte bVar2;
  char *__ptr;
  Transporter *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  string text;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  document;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  __ptr = this->buf;
  sVar6 = this->receiveSize;
  if (this->bufSize < sVar6 + len) {
    __ptr = (char *)realloc(__ptr,this->bufSize + len);
    this->buf = __ptr;
    sVar6 = this->receiveSize;
  }
  memcpy(__ptr + sVar6,data,len);
  sVar6 = len + this->receiveSize;
  this->receiveSize = sVar6;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    uVar1 = uVar3;
    if (uVar3 <= sVar6 && sVar6 - uVar3 != 0) {
      do {
        uVar4 = uVar1 + 1;
        uVar5 = uVar4;
        if (data[uVar1] == '\n') break;
        uVar5 = uVar3;
        uVar1 = uVar4;
      } while (uVar4 != sVar6);
    }
    if (uVar3 == uVar5) {
      if (uVar3 != 0) {
        memcpy(this->buf,this->buf + uVar3,sVar6 - uVar3);
        this->receiveSize = this->receiveSize - uVar3;
      }
      return;
    }
    bVar2 = this->readHead;
    if ((bool)bVar2 == false) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,this->buf + uVar3,this->buf + uVar5);
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_40,&local_70,(parser_callback_t *)&local_98,true,false);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      this_00 = (Transporter *)&stack0xffffffffffffffb0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffffb0,&local_40);
      OnReceiveMessage(this_00,(json *)&stack0xffffffffffffffb0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&stack0xffffffffffffffb0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar2 = this->readHead;
      sVar6 = this->receiveSize;
    }
    this->readHead = (bool)(bVar2 ^ 1);
    uVar3 = uVar5;
  } while( true );
}

Assistant:

void Transporter::Receive(const char* data, size_t len)
{
	if (bufSize < len + receiveSize)
	{
		// maybe a bug
		buf = static_cast<char*>(realloc(buf, bufSize + len));
	}
	memcpy(buf + receiveSize, data, len);
	receiveSize += len;

	size_t pos = 0;
	while (true)
	{
		size_t start = pos;
		for (size_t i = pos; i < receiveSize; i++)
		{
			if (data[i] == '\n')
			{
				pos = i + 1;
				break;
			}
		}
		if (start != pos)
		{
			if (readHead)
			{
				// skip
			}
			else
			{
				std::string text(buf + start, pos - start);
				auto document = nlohmann::json::parse(text);
				// bug 如果lua代码执行结束,这里行为未定义
				OnReceiveMessage(document);
			}
			readHead = !readHead;
		}
		else break;
	}

	if (pos > 0)
	{
		memcpy(buf, buf + pos, receiveSize - pos);
		receiveSize -= pos;
	}
}